

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_lu.c
# Opt level: O3

_Bool test_lu_invmul_x(_Bool inplace,int n_row,int n_col,int N,int field)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint8_t *puVar4;
  byte bVar5;
  int n_row_00;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  int *cp;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  uint uVar15;
  int *rp;
  ulong uVar16;
  _Bool _Var17;
  int aiStack_120 [2];
  undefined1 local_118 [8];
  m256v X;
  m256v X1;
  m256v A;
  undefined1 local_78 [8];
  m256v Y;
  
  n_row_00 = n_col;
  if (n_col < n_row) {
    n_row_00 = n_row;
  }
  bVar5 = get_mask(N);
  uVar15 = n_col * n_row;
  uVar16 = (ulong)(uint)(n_col * 4);
  _Var17 = false;
  uVar12 = uVar16 + 0xf & 0xfffffffffffffff0;
  uVar9 = (ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0;
  uVar10 = (ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0;
  uVar8 = 0;
  while( true ) {
    lVar1 = -((ulong)uVar15 + 0xf & 0xfffffffffffffff0);
    puVar11 = local_118 + lVar1;
    if (0 < (int)uVar15) {
      uVar13 = 0;
      do {
        *(undefined8 *)((long)aiStack_120 + lVar1) = 0x101faf;
        iVar6 = rand();
        puVar11[uVar13] = (byte)iVar6 & bVar5;
        uVar13 = uVar13 + 1;
      } while (uVar15 != uVar13);
    }
    *(undefined8 *)((long)aiStack_120 + lVar1) = 0x101fd7;
    m256v_make((m256v *)&X1.e,n_row,n_col,puVar11);
    lVar2 = -uVar12;
    puVar11 = puVar11 + lVar2;
    if (0 < n_col) {
      uVar13 = 0;
      do {
        puVar11[-8] = 0xf1;
        puVar11[-7] = '\x1f';
        puVar11[-6] = '\x10';
        puVar11[-5] = '\0';
        puVar11[-4] = '\0';
        puVar11[-3] = '\0';
        puVar11[-2] = '\0';
        puVar11[-1] = '\0';
        iVar6 = rand();
        puVar11[uVar13] = (byte)iVar6 & bVar5;
        uVar13 = uVar13 + 1;
      } while (uVar16 != uVar13);
    }
    builtin_memcpy(local_118 + lVar2 + lVar1 + -8,"\x1b \x10",4);
    puVar11[-4] = '\0';
    puVar11[-3] = '\0';
    puVar11[-2] = '\0';
    puVar11[-1] = '\0';
    m256v_make((m256v *)local_118,n_col,4,puVar11);
    lVar3 = -((ulong)(uint)(n_row_00 * 4) + 0xf & 0xfffffffffffffff0);
    puVar11 = puVar11 + lVar3;
    builtin_memcpy(local_118 + lVar3 + lVar2 + lVar1 + -8,"= \x10",4);
    puVar11[-4] = '\0';
    puVar11[-3] = '\0';
    puVar11[-2] = '\0';
    puVar11[-1] = '\0';
    m256v_make((m256v *)local_78,n_row_00,4,puVar11);
    local_78._0_4_ = n_row;
    builtin_memcpy(local_118 + lVar3 + lVar2 + lVar1 + -8,"X \x10",4);
    puVar11[-4] = '\0';
    puVar11[-3] = '\0';
    puVar11[-2] = '\0';
    puVar11[-1] = '\0';
    m256v_mul((m256v *)&X1.e,(m256v *)local_118,(m256v *)local_78);
    rp = (int *)(puVar11 + -uVar9);
    cp = (int *)((long)rp - uVar10);
    cp[-2] = 0x10207d;
    cp[-1] = 0;
    iVar6 = m256v_LU_decomp_inplace((m256v *)&X1.e,rp,cp);
    Y.e = (uint8_t *)cp;
    if (inplace) {
      piVar14 = (int *)((long)cp - uVar10);
      piVar14[-2] = 0x1020b3;
      piVar14[-1] = 0;
      perm_invert(n_col,cp,piVar14);
      local_78._0_4_ = n_row_00;
      piVar14[-2] = 0x1020d9;
      piVar14[-1] = 0;
      m256v_LU_invmult_inplace((m256v *)&X1.e,iVar6,rp,piVar14,(m256v *)local_78);
      local_78._0_4_ = n_col;
    }
    else {
      puVar11 = (uint8_t *)((long)cp - uVar12);
      if (n_col < 1) {
        puVar11[-8] = 0x8e;
        puVar11[-7] = '!';
        puVar11[-6] = '\x10';
        puVar11[-5] = '\0';
        puVar11[-4] = '\0';
        puVar11[-3] = '\0';
        puVar11[-2] = '\0';
        puVar11[-1] = '\0';
        m256v_make((m256v *)&X.e,n_col,4,puVar11);
        puVar4 = Y.e;
        puVar11[-8] = 0xb3;
        puVar11[-7] = '!';
        puVar11[-6] = '\x10';
        puVar11[-5] = '\0';
        puVar11[-4] = '\0';
        puVar11[-3] = '\0';
        puVar11[-2] = '\0';
        puVar11[-1] = '\0';
        m256v_LU_invmult((m256v *)&X1.e,iVar6,rp,(int *)puVar4,(m256v *)local_78,(m256v *)&X.e);
        local_78._0_4_ = n_col;
      }
      else {
        uVar13 = 0;
        do {
          builtin_memcpy(puVar11 + -8,"\x05!\x10",4);
          puVar11[-4] = '\0';
          puVar11[-3] = '\0';
          puVar11[-2] = '\0';
          puVar11[-1] = '\0';
          iVar7 = rand();
          puVar11[uVar13] = (byte)iVar7 & bVar5;
          uVar13 = uVar13 + 1;
        } while (uVar16 != uVar13);
        builtin_memcpy(puVar11 + -8,"+!\x10",4);
        puVar11[-4] = '\0';
        puVar11[-3] = '\0';
        puVar11[-2] = '\0';
        puVar11[-1] = '\0';
        m256v_make((m256v *)&X.e,n_col,4,puVar11);
        puVar4 = Y.e;
        builtin_memcpy(puVar11 + -8,"L!\x10",4);
        puVar11[-4] = '\0';
        puVar11[-3] = '\0';
        puVar11[-2] = '\0';
        puVar11[-1] = '\0';
        m256v_LU_invmult((m256v *)&X1.e,iVar6,rp,(int *)puVar4,(m256v *)local_78,(m256v *)&X.e);
        local_78._0_4_ = n_col;
        if (0 < n_col) {
          iVar7 = 0;
          do {
            builtin_memcpy(puVar11 + -8,"k!\x10",4);
            puVar11[-4] = '\0';
            puVar11[-3] = '\0';
            puVar11[-2] = '\0';
            puVar11[-1] = '\0';
            m256v_copy_row((m256v *)&X.e,iVar7,(m256v *)local_78,iVar7);
            iVar7 = iVar7 + 1;
          } while (n_col != iVar7);
        }
      }
    }
    cp[-2] = 0x1021d0;
    cp[-1] = 0;
    m256v_add_inplace((m256v *)local_118,(m256v *)local_78);
    if (iVar6 < n_col) {
      piVar14 = (int *)((long)cp - uVar9);
      piVar14[-2] = 0x1021f7;
      piVar14[-1] = 0;
      perm_invert(n_row,rp,piVar14);
      piVar14[-2] = 0x102218;
      piVar14[-1] = 0;
      local_78._0_4_ = n_row_00;
      m256v_LU_mult_inplace((m256v *)&X1.e,piVar14,(int *)Y.e,(m256v *)local_78);
      local_78._0_4_ = n_row;
    }
    cp[-2] = 0x102227;
    cp[-1] = 0;
    iVar6 = m256v_iszero((m256v *)local_78);
    if (iVar6 == 0) break;
    _Var17 = 0x270e < uVar8;
    uVar8 = uVar8 + 1;
    if (uVar8 == 10000) {
      return true;
    }
  }
  cp[-2] = 0x10228a;
  cp[-1] = 0;
  fprintf(_stderr,"Error:  LU inversion gave wrong result. (field=%d, it=%d)\n",(ulong)(uint)N);
  return _Var17;
}

Assistant:

static bool test_lu_invmul_x(bool inplace, int n_row, int n_col, int N, int field)
{
	const int maxdim = (n_row > n_col ? n_row : n_col);
	const int data_width = 4;
	const uint8_t mask = get_mask(field);

	int ntest = 0;
	for (int i = 0; i < N; ++i) {
		/* Create a random matrix & testing data */
		Def_mat256_rand(A, a, n_row, n_col, mask)
		Def_mat256_rand(X, x, n_col, data_width, mask)

		/* Compute Y := A*X the direct way */
		m256v_Def(Y, y, maxdim, data_width)
		Y.n_row = n_row;
		m256v_mul(&A, &X, &Y);

		/* Calculate LU decomposition */
		int rp[n_row], cp[n_col];
		const int rank = m256v_LU_decomp_inplace(&A, rp, cp);
		++ntest;

		/* Reconstruct X from LU and Y.
		 *
		 * This is not completely possible if the rank of the
		 * matrix is not full.  In such cases, we check if the
		 * difference of X with its reconstructed version is in
		 * the kernel of A.
		 */
		if (inplace) {
			int inv_cp[n_col];
			perm_invert(n_col, cp, inv_cp);

			Y.n_row = maxdim;
			m256v_LU_invmult_inplace(&A, rank, rp, inv_cp, &Y);
			Y.n_row = n_col;
		} else {
			Def_mat256_rand(X1, x1, n_col, data_width, mask)
			m256v_LU_invmult(&A, rank, rp, cp, &Y, &X1);

			/* Copy result back into Y */
			Y.n_row = n_col;
			for (int i = 0; i < n_col; ++i)
				m256v_copy_row(&X1, i, &Y, i);
		}

		/* Check the result */
		m256v_add_inplace(&X, &Y);
		if (rank < n_col) {
			/* If the matrix is not full rank, the resulting
			 * difference is not necessarily zero, but it
			 * must be in the kernel of A.
			 */
			int inv_rp[n_row];
			perm_invert(n_row, rp, inv_rp);
			Y.n_row = maxdim;
			m256v_LU_mult_inplace(&A, inv_rp, cp, &Y);
			Y.n_row = n_row;
		}
		if (!m256v_iszero(&Y)) {
			fprintf(stderr, "Error:  LU inversion gave "
			  "wrong result. (field=%d, it=%d)\n", field, i);
			return false;
		}
	}

	return true;
}